

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O0

void lumeview::MessageQueue::remove_receiver(MessageReceiver *rec)

{
  __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
  this;
  bool bVar1;
  MessageQueue *pMVar2;
  const_iterator local_40;
  __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
  local_38;
  MessageReceiver **local_30;
  __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
  local_28;
  __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
  local_20;
  __normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
  it;
  vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *receivers;
  MessageReceiver *rec_local;
  
  receivers = (vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *)
              rec;
  pMVar2 = inst();
  it._M_current = (MessageReceiver **)&pMVar2->m_receivers;
  local_28._M_current =
       (MessageReceiver **)
       std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::begin
                 ((vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
                   *)it._M_current);
  local_30 = (MessageReceiver **)
             std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
             ::end(it._M_current);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<lumeview::MessageReceiver**,std::vector<lumeview::MessageReceiver*,std::allocator<lumeview::MessageReceiver*>>>,lumeview::MessageReceiver*>
                       (local_28,(__normal_iterator<lumeview::MessageReceiver_**,_std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>_>
                                  )local_30,(MessageReceiver **)&receivers);
  local_38._M_current =
       (MessageReceiver **)
       std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::end
                 (it._M_current);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  this = it;
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<lumeview::MessageReceiver*const*,std::vector<lumeview::MessageReceiver*,std::allocator<lumeview::MessageReceiver*>>>
    ::__normal_iterator<lumeview::MessageReceiver**>
              ((__normal_iterator<lumeview::MessageReceiver*const*,std::vector<lumeview::MessageReceiver*,std::allocator<lumeview::MessageReceiver*>>>
                *)&local_40,&local_20);
    std::vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>::erase
              ((vector<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_> *)
               this._M_current,local_40);
  }
  return;
}

Assistant:

void MessageQueue::remove_receiver (MessageReceiver* rec)
{
	auto& receivers = inst().m_receivers;
	auto it = find (receivers.begin(), receivers.end(), rec);
	if (it != receivers.end())
		receivers.erase (it);
}